

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::decide_to_pick_resonance(particleSamples *this,int monval)

{
  int pick_flag;
  int monval_local;
  particleSamples *this_local;
  
  pick_flag = 0;
  if (this->particle_monval == 0xc32) {
    pick_flag = (int)(monval == 0xc8c);
  }
  else if (this->particle_monval == -0xc32) {
    pick_flag = (int)(monval == -0xc8c);
  }
  return pick_flag;
}

Assistant:

int particleSamples::decide_to_pick_resonance(int monval) {
    int pick_flag = 0;
    if (particle_monval == 3122) {
        // Lambda particles, we will consider feed down from Sigma^0
        if (monval == 3212) pick_flag = 1;
    } else if (particle_monval == -3122) {
        // Anti-Lambda particles, we will consider feed down from Anti-Sigma^0
        if (monval == -3212) pick_flag = 1;
    }
    return (pick_flag);
}